

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O2

void QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture,QGles2RenderBuffer>
               (QRhiTextureRenderTargetDescription *desc,ResIdList *dst)

{
  undefined8 *puVar1;
  long lVar2;
  QRhiResource *pQVar3;
  QRhiTexture *this;
  QRhiRenderBuffer *this_00;
  quint64 qVar4;
  int iVar5;
  void *pvVar6;
  undefined4 uVar7;
  long lVar8;
  uint uVar9;
  QRhiColorAttachment *colorAtt;
  undefined8 *puVar10;
  QGles2RenderBuffer *depthRbD;
  long lVar11;
  QGles2Texture *texD;
  bool bVar12;
  
  bVar12 = desc->m_depthTexture != (QRhiTexture *)0x0 ||
           desc->m_depthStencilBuffer != (QRhiRenderBuffer *)0x0;
  QVarLengthArray<QRhiRenderTargetAttachmentTracker::ResId,_17LL>::resize
            (dst,(ulong)bVar12 +
                 (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s
                 * 2);
  puVar1 = (undefined8 *)
           (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.ptr;
  lVar2 = (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s;
  lVar8 = 0;
  uVar9 = 0;
  puVar10 = puVar1;
  for (lVar11 = 0; lVar2 * 0x30 != lVar11; lVar11 = lVar11 + 0x30) {
    pQVar3 = (QRhiResource *)*puVar10;
    if (pQVar3 == (QRhiResource *)0x0) {
      pQVar3 = *(QRhiResource **)((long)puVar1 + lVar11 + 8);
      if (pQVar3 == (QRhiResource *)0x0) {
        qVar4 = 0;
        uVar7 = 0;
      }
      else {
        qVar4 = QRhiResource::globalResourceId(pQVar3);
        uVar7 = (undefined4)pQVar3[1].m_objectName.d.size;
      }
    }
    else {
      qVar4 = QRhiResource::globalResourceId(pQVar3);
      uVar7 = *(undefined4 *)((long)&pQVar3[3].m_id + 4);
    }
    pvVar6 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.ptr;
    *(quint64 *)((long)pvVar6 + lVar8) = qVar4;
    *(undefined4 *)((long)pvVar6 + lVar8 + 8) = uVar7;
    pQVar3 = (QRhiResource *)puVar10[3];
    if (pQVar3 == (QRhiResource *)0x0) {
      qVar4 = 0;
      uVar7 = 0;
    }
    else {
      qVar4 = QRhiResource::globalResourceId(pQVar3);
      uVar7 = *(undefined4 *)((long)&pQVar3[3].m_id + 4);
      pvVar6 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.
               ptr;
    }
    *(quint64 *)((long)pvVar6 + lVar8 + 0x10) = qVar4;
    *(undefined4 *)((long)pvVar6 + lVar8 + 0x18) = uVar7;
    puVar10 = puVar10 + 6;
    uVar9 = uVar9 + 2;
    lVar8 = lVar8 + 0x20;
  }
  if (bVar12) {
    this = desc->m_depthTexture;
    if (this == (QRhiTexture *)0x0) {
      this_00 = desc->m_depthStencilBuffer;
      if (this_00 == (QRhiRenderBuffer *)0x0) {
        qVar4 = 0;
        iVar5 = 0;
      }
      else {
        qVar4 = QRhiResource::globalResourceId(&this_00->super_QRhiResource);
        iVar5 = (int)this_00[1].super_QRhiResource.m_id;
      }
    }
    else {
      qVar4 = QRhiResource::globalResourceId(&this->super_QRhiResource);
      iVar5 = this[1].m_depth;
    }
    pvVar6 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.ptr;
    *(quint64 *)((long)pvVar6 + (ulong)uVar9 * 0x10) = qVar4;
    *(int *)((long)pvVar6 + (ulong)uVar9 * 0x10 + 8) = iVar5;
  }
  return;
}

Assistant:

void QRhiRenderTargetAttachmentTracker::updateResIdList(const QRhiTextureRenderTargetDescription &desc, ResIdList *dst)
{
    const bool hasDepthStencil = desc.depthStencilBuffer() || desc.depthTexture();
    dst->resize(desc.colorAttachmentCount() * 2 + (hasDepthStencil ? 1 : 0));
    int n = 0;
    for (auto it = desc.cbeginColorAttachments(), itEnd = desc.cendColorAttachments(); it != itEnd; ++it, ++n) {
        const QRhiColorAttachment &colorAtt(*it);
        if (colorAtt.texture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.texture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else if (colorAtt.renderBuffer()) {
            RenderBufferType *rbD = QRHI_RES(RenderBufferType, colorAtt.renderBuffer());
            (*dst)[n] = { rbD->globalResourceId(), rbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
        ++n;
        if (colorAtt.resolveTexture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.resolveTexture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
    if (hasDepthStencil) {
        if (desc.depthTexture()) {
            TexType *depthTexD = QRHI_RES(TexType, desc.depthTexture());
            (*dst)[n] = { depthTexD->globalResourceId(), depthTexD->generation };
        } else if (desc.depthStencilBuffer()) {
            RenderBufferType *depthRbD = QRHI_RES(RenderBufferType, desc.depthStencilBuffer());
            (*dst)[n] = { depthRbD->globalResourceId(), depthRbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
}